

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void av1_update_frame_size(AV1_COMP *cpi)

{
  SequenceHeader *seq_params;
  BLOCK_SIZE sb_size;
  long *in_RDI;
  CommonModeInfoParams *mi_params;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  TileConfig *in_stack_00000038;
  AV1_COMMON *in_stack_00000040;
  MACROBLOCKD *xd_00;
  AV1_COMMON *cm_00;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x77f0);
  xd_00 = (MACROBLOCKD *)(in_RDI + 0x2a3a);
  (*(code *)in_RDI[0x783c])
            (in_RDI + 0x7831,(int)in_RDI[0x77f7],*(undefined4 *)((long)in_RDI + 0x3bfbc),
             *(undefined1 *)((long)in_RDI + 0x6096a));
  av1_init_macroblockd(cm_00,xd_00);
  if (*(int *)(*in_RDI + 0x178) == 0) {
    seq_params = cm_00->seq_params;
    sb_size = av1_select_sb_size((AV1EncoderConfig *)(in_RDI + 0x8464),cm_00->width,cm_00->height,
                                 *(int *)(*in_RDI + 0xc75c));
    set_sb_size(seq_params,sb_size);
  }
  set_tile_info(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

void av1_update_frame_size(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;

  // Setup mi_params here in case we need more mi's.
  CommonModeInfoParams *const mi_params = &cm->mi_params;
  mi_params->set_mb_mi(mi_params, cm->width, cm->height,
                       cpi->sf.part_sf.default_min_partition_size);

  av1_init_macroblockd(cm, xd);

  if (!cpi->ppi->seq_params_locked)
    set_sb_size(cm->seq_params,
                av1_select_sb_size(&cpi->oxcf, cm->width, cm->height,
                                   cpi->ppi->number_spatial_layers));

  set_tile_info(cm, &cpi->oxcf.tile_cfg);
}